

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

bool megumax::legal_pv(Position *pos,MoveList *move_list)

{
  bool bVar1;
  reference pMVar2;
  int i;
  Move *move;
  iterator __end1;
  iterator __begin1;
  MoveList *__range1;
  int ply;
  Position *in_stack_00000100;
  Position *in_stack_00000158;
  Move in_stack_00000164;
  Position *in_stack_000001c8;
  Move in_stack_000001d0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar3;
  value_type in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc4;
  __normal_iterator<libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
  local_28 [2];
  int local_14;
  
  local_14 = 0;
  local_28[0]._M_current =
       (Move *)libchess::MoveList::begin
                         ((MoveList *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  libchess::MoveList::end((MoveList *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (__normal_iterator<libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)), bVar1
        ) {
    pMVar2 = __gnu_cxx::
             __normal_iterator<libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
             ::operator*(local_28);
    in_stack_ffffffffffffffc4 = pMVar2->value_;
    bVar1 = libchess::Position::is_legal_move(in_stack_000001c8,in_stack_000001d0);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 = pMVar2->value_;
    libchess::Position::make_move(in_stack_00000158,in_stack_00000164);
    local_14 = local_14 + 1;
    __gnu_cxx::
    __normal_iterator<libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
    ::operator++(local_28);
  }
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    libchess::Position::unmake_move(in_stack_00000100);
  }
  iVar3 = libchess::MoveList::size((MoveList *)0x127541);
  return local_14 == iVar3;
}

Assistant:

bool legal_pv(Position& pos, MoveList&& move_list) {
    int ply = 0;

    for (const auto& move : move_list) {
        if (pos.is_legal_move(move)) {
            pos.make_move(move);
            ply++;
        } else {
            break;
        }
    }

    for (int i = 0; i < ply; ++i) {
        pos.unmake_move();
    }

    return ply == move_list.size();
}